

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_uptime.c
# Opt level: O2

void test_calc_uptime_minutes(void **state)

{
  char *__ptr;
  
  _expect_string("__wrap_uptime","uptime_path",
                 "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/build_O2/_deps/cmocka-src/example/mock/uptime/test_uptime.c"
                 ,0x47,"/proc/uptime",1);
  _will_return("__wrap_uptime",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/build_O2/_deps/cmocka-src/example/mock/uptime/test_uptime.c"
               ,0x4a,0x1fc,1);
  _will_return("__wrap_uptime",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/build_O2/_deps/cmocka-src/example/mock/uptime/test_uptime.c"
               ,0x4b,0x48,1);
  __ptr = calc_uptime();
  _assert_true(__ptr,"uptime_str",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/build_O2/_deps/cmocka-src/example/mock/uptime/test_uptime.c"
               ,0x51);
  _assert_string_equal
            (__ptr,"up 8 minutes",
             "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/build_O2/_deps/cmocka-src/example/mock/uptime/test_uptime.c"
             ,0x52);
  free(__ptr);
  return;
}

Assistant:

static void test_calc_uptime_minutes(void **state)
{
    char *uptime_str = NULL;

    UNUSED(state);

    /* Make sure the passed 'in' argument is correct */
    expect_string(__wrap_uptime, uptime_path, "/proc/uptime");

    /* We tell the uptime function what values it should return */
    will_return(__wrap_uptime, 508.16);
    will_return(__wrap_uptime, 72.23);

    /* We call the function like we would do it normally */
    uptime_str = calc_uptime();

    /* Now lets check if the result is what we expect it to be */
    assert_non_null(uptime_str);
    assert_string_equal(uptime_str, "up 8 minutes");

    free(uptime_str);
}